

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O3

OptimizerResult
TasGrid::Optimizer::performSecantSearch<(TasGrid::TypeOneDRule)15>
          (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double left,double right)

{
  uint uVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  OptimizerResult OVar8;
  
  dVar3 = getDerivative<(TasGrid::TypeOneDRule)15>(current,left);
  dVar4 = getDerivative<(TasGrid::TypeOneDRule)15>(current,right);
  dVar6 = ABS(dVar4);
  dVar7 = left;
  dVar5 = dVar4;
  if (ABS(dVar3) < dVar6) {
    dVar6 = ABS(dVar3);
    dVar7 = right;
    dVar5 = dVar3;
    dVar3 = dVar4;
    right = left;
  }
  if (3e-12 < dVar6) {
    dVar6 = right;
    uVar1 = 0;
    do {
      dVar4 = dVar5;
      right = dVar6 - ((dVar6 - dVar7) * dVar4) / (dVar4 - dVar3);
      dVar5 = getDerivative<(TasGrid::TypeOneDRule)15>(current,right);
      if (ABS(dVar5) <= 3e-12) break;
      bVar2 = uVar1 < 999;
      dVar7 = dVar6;
      dVar3 = dVar4;
      dVar6 = right;
      uVar1 = uVar1 + 1;
    } while (bVar2);
  }
  OVar8.value = dVar5;
  OVar8.node = right;
  return OVar8;
}

Assistant:

OptimizerResult performSecantSearch(CurrentNodes<rule> const& current, double left, double right){
    auto func = [&](double x)->OptimizerResult{ return {x, getDerivative<rule>(current, x)}; };

    OptimizerResult past    = func(left);
    OptimizerResult present = func(right);

    if (std::abs(past.value) < std::abs(present.value))
        std::swap(past, present);

    int iterations = 0;
    while((std::abs(present.value) > 3.0 * Maths::num_tol) && (iterations < 1000)){ // 1000 guards against stagnation
        OptimizerResult future = func(present.node - present.value * (present.node - past.node) / (present.value - past.value));
        past    = present;
        present = future;
        iterations++;
    }

    return present;
}